

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMImage * MT32Emu::ROMImage::makeFullROMImage(Bit8u *data,size_t dataSize)

{
  ROMImage *this;
  ArrayFile *this_00;
  
  this = (ROMImage *)operator_new(0x18);
  this_00 = (ArrayFile *)operator_new(0x50);
  ArrayFile::ArrayFile(this_00,data,dataSize);
  getROMInfoLists();
  ROMImage(this,(File *)this_00,true,getROMInfoLists::ALL_ROM_INFOS);
  return this;
}

Assistant:

const ROMImage *ROMImage::makeFullROMImage(Bit8u *data, size_t dataSize) {
	return new ROMImage(new ArrayFile(data, dataSize), true, getKnownROMInfoList());
}